

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mser.c
# Opt level: O1

void drawEllipse(float *region,int width,int height,int depth,uchar *bits,uint8_t *color)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  
  fVar1 = *region;
  fVar2 = region[1];
  fVar8 = region[3];
  fVar7 = region[4];
  fVar11 = region[2] + fVar7;
  fVar9 = region[2] - fVar7;
  fVar9 = fVar8 * 4.0 * fVar8 + fVar9 * fVar9;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar10 = (fVar11 + fVar9) * 0.5;
  local_50 = (fVar11 - fVar9) * 0.5;
  if (fVar10 < 0.0) {
    local_48 = sqrtf(fVar10);
  }
  else {
    local_48 = SQRT(fVar10);
  }
  if (local_50 < 0.0) {
    local_44 = sqrtf(local_50);
  }
  else {
    local_44 = SQRT(local_50);
  }
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    fVar10 = fVar10 - fVar7;
    local_50 = local_50 - fVar7;
    local_4c = fVar10 * fVar10 + fVar8 * fVar8;
    if (local_4c < 0.0) {
      local_4c = sqrtf(local_4c);
    }
    else {
      local_4c = SQRT(local_4c);
    }
    local_4c = local_48 / local_4c;
    fVar7 = local_50 * local_50 + fVar8 * fVar8;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    local_48 = fVar10 * local_4c;
    local_4c = local_4c * fVar8;
    local_50 = local_50 * (local_44 / fVar7);
    local_44 = (local_44 / fVar7) * fVar8;
  }
  else {
    local_50 = 0.0;
    local_4c = 0.0;
  }
  uVar5 = 3;
  if (depth < 3) {
    uVar5 = (ulong)(uint)depth;
  }
  fVar8 = 0.0;
  do {
    fVar7 = cosf(fVar8);
    fVar9 = sinf(fVar8);
    fVar7 = fVar7 * local_48 + fVar9 * local_50;
    iVar6 = (int)(fVar7 + fVar7 + fVar1 + 0.5);
    fVar7 = cosf(fVar8);
    fVar9 = sinf(fVar8);
    if (-1 < iVar6) {
      fVar7 = fVar7 * local_4c + fVar9 * local_44;
      iVar3 = (int)(fVar7 + fVar7 + fVar2 + 0.5);
      if ((-1 < iVar3 && 0 < depth) && (iVar3 < height && iVar6 < width)) {
        uVar4 = 0;
        do {
          bits[uVar4 + (long)((iVar3 * width + iVar6) * depth)] = color[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
    }
    fVar8 = fVar8 + 0.001;
  } while (fVar8 < 6.2831855);
  return;
}

Assistant:

void drawEllipse(const float *region, int width, int height, int depth, unsigned char *bits, const uint8_t *color) {
    /* Centroid (mean) */
    const float x = region[0];
    const float y = region[1];

    /* Covariance matrix [a b; b c] */
    const float a = region[2];
    const float b = region[3];
    const float c = region[4];

    /* Eigenvalues of the covariance matrix */
    const float d = a + c;
    const float e = a - c;
    const float f = sqrtf(4.0f * b * b + e * e);
    const float e0 = (d + f) / 2.0f;       /* First eigenvalue */
    const float e1 = (d - f) / 2.0f;       /* Second eigenvalue */

    /* Desired norm of the eigenvectors */
    const float e0sq = sqrtf(e0);
    const float e1sq = sqrtf(e1);

    /* Eigenvectors */
    float v0x = e0sq;
    float v0y = 0.0f;
    float v1x = 0.0f;
    float v1y = e1sq;

    if (b) {
        v0x = e0 - c;
        v0y = b;
        v1x = e1 - c;
        v1y = b;

        /* Normalize the eigenvectors */
        const float n0 = e0sq / sqrtf(v0x * v0x + v0y * v0y);
        v0x *= n0;
        v0y *= n0;

        const float n1 = e1sq / sqrtf(v1x * v1x + v1y * v1y);
        v1x *= n1;
        v1y *= n1;
    }

    for (float t = 0.0f; t < 2.0f * M_PI; t += 0.001f) {
        int x2 = (int) (x + (cosf(t) * v0x + sinf(t) * v1x) * 2.0f + 0.5f);
        int y2 = (int) (y + (cosf(t) * v0y + sinf(t) * v1y) * 2.0f + 0.5f);

        if ((x2 >= 0) && (x2 < width) && (y2 >= 0) && (y2 < height))
            for (int i = 0; i < min(depth, 3); ++i)
                bits[(y2 * width + x2) * depth + i] = color[i];
    }
}